

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

pair<example::spread_t,_boost::asio::const_buffer> *
read<example::spread_t>
          (pair<example::spread_t,_boost::asio::const_buffer> *__return_storage_ptr__,const_buffer b
          )

{
  UI_STRING *uis;
  spread_t *__x;
  undefined1 local_98 [8];
  spread_t res;
  undefined1 local_40 [8];
  reader r;
  const_buffer b_local;
  
  res.legs.val_.super_type.m_storage.dummy_._16_8_ = b.data_;
  r.opts_.super_type.m_storage.dummy_ = (dummy_u)res.legs.val_.super_type.m_storage.dummy_._16_8_;
  detail::reader::reader
            ((reader *)local_40,(UI *)res.legs.val_.super_type.m_storage.dummy_._16_8_,
             (UI_STRING *)b.size_);
  example::spread_t::spread_t((spread_t *)local_98);
  detail::reader::operator()((reader *)local_40,(spread_t *)local_98);
  __x = (spread_t *)local_98;
  std::make_pair<example::spread_t&,boost::asio::const_buffer&>
            (__return_storage_ptr__,__x,(const_buffer *)local_40);
  example::spread_t::~spread_t((spread_t *)local_98);
  detail::reader::~reader((reader *)local_40,(UI *)__x,uis);
  return __return_storage_ptr__;
}

Assistant:

std::pair<T, asio::const_buffer> read(asio::const_buffer b) {
    detail::reader r(std::move(b));
    T res;
    r(res);
    return std::make_pair(res, r.buf_);
}